

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O0

void __thiscall
xLearn::FMScore::calc_grad_sgd(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  index_t iVar5;
  pointer pNVar6;
  real_t *prVar7;
  uint uVar8;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  real_t rVar9;
  float fVar10;
  double dVar11;
  float fVar13;
  float fVar14;
  undefined1 auVar12 [16];
  float fVar15;
  float in_XMM1_Da;
  __m128 XMMg;
  __m128 XMMw_1;
  __m128 XMMs_1;
  index_t d_1;
  __m128 XMMpgv;
  __m128 XMMv_1;
  real_t *w_2;
  real_t v1_1;
  index_t j1_1;
  const_iterator iter_2;
  __m128 XMMw;
  __m128 XMMs;
  index_t d;
  __m128 XMMv;
  real_t *w_1;
  real_t v1;
  index_t j1;
  const_iterator iter_1;
  real_t *s;
  vector<float,_std::allocator<float>_> sv;
  __m128 XMMlamb;
  __m128 XMMlr;
  __m128 XMMpg;
  index_t align0;
  index_t aligned_k;
  real_t g;
  real_t *wb;
  real_t g_1;
  real_t *wl;
  index_t feat_id;
  const_iterator iter;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  undefined1 in_stack_fffffffffffffa58 [16];
  allocator_type *in_stack_fffffffffffffa68;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  undefined8 local_558;
  undefined8 uStack_550;
  uint local_3dc;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  uint local_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  real_t *local_350;
  float local_348;
  uint local_344;
  Node *local_340;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_338;
  float *local_330;
  undefined4 local_314;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  int local_2bc;
  index_t local_2b8;
  float local_2b4;
  real_t *local_2b0;
  uint local_2a4;
  real_t *local_2a0;
  uint local_294;
  Node *local_290;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_288;
  index_t local_27c;
  real_t *local_278;
  float local_26c;
  float local_268;
  float local_264;
  Model *local_260;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1ac;
  undefined1 (*local_1a8) [16];
  undefined1 (*local_1a0) [16];
  real_t *local_198;
  float *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  vector<float,_std::allocator<float>_> *pvStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  real_t *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  vector<float,_std::allocator<float>_> *pvStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_268 = in_XMM1_Da;
  local_264 = in_XMM0_Da;
  local_260 = in_RDX;
  dVar11 = std::sqrt((double)(ulong)(uint)in_XMM1_Da);
  local_26c = SUB84(dVar11,0);
  local_278 = Model::GetParameter_w(local_260);
  local_27c = Model::GetNumFeature(local_260);
  local_288._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffa58._0_8_);
  while( true ) {
    local_290 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffa58._0_8_);
    bVar4 = __gnu_cxx::operator!=(in_stack_fffffffffffffa58._8_8_,in_stack_fffffffffffffa58._0_8_);
    if (!bVar4) break;
    pNVar6 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_288);
    fVar10 = local_264;
    local_294 = pNVar6->feat_id;
    if (local_294 < local_27c) {
      local_2a0 = local_278 + local_294;
      uVar8 = *(uint *)(in_RDI + 0xc);
      rVar9 = *local_2a0;
      pNVar6 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_288);
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)rVar9),ZEXT416(uVar8),
                                ZEXT416((uint)(fVar10 * pNVar6->feat_val * local_26c)));
      local_2a4 = auVar12._0_4_;
      auVar12 = vfmadd213ss_fma(ZEXT416(local_2a4),ZEXT416(*(uint *)(in_RDI + 8) ^ 0x80000000),
                                ZEXT416((uint)*local_2a0));
      *local_2a0 = auVar12._0_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_288);
  }
  local_2b0 = Model::GetParameter_b(local_260);
  local_2b4 = local_264;
  auVar12 = vfnmadd213ss_fma(ZEXT416((uint)local_264),ZEXT416(*(uint *)(in_RDI + 8)),
                             ZEXT416((uint)*local_2b0));
  *local_2b0 = auVar12._0_4_;
  local_278 = local_2b0;
  local_2b8 = Model::get_aligned_k((Model *)0x1ffef4);
  iVar5 = Model::get_aligned_k((Model *)0x1fff08);
  auVar12 = vcvtusi2ss_avx512f(auVar12,iVar5);
  rVar9 = Model::GetAuxiliarySize(local_260);
  local_2bc = vcvttss2usi_avx512f(ZEXT416((uint)(auVar12._0_4_ * rVar9)));
  local_1ac = local_264;
  local_1c8 = local_264;
  fStack_1c4 = local_264;
  fStack_1c0 = local_264;
  fStack_1bc = local_264;
  local_2d8 = CONCAT44(local_264,local_264);
  uStack_2d0 = CONCAT44(local_264,local_264);
  local_1e8 = *(undefined4 *)(in_RDI + 8);
  local_2e8 = CONCAT44(local_1e8,local_1e8);
  uStack_2e0 = CONCAT44(local_1e8,local_1e8);
  local_208 = *(undefined4 *)(in_RDI + 0xc);
  local_2f8 = CONCAT44(local_208,local_208);
  uStack_2f0 = CONCAT44(local_208,local_208);
  local_314 = 0;
  uStack_204 = local_208;
  uStack_200 = local_208;
  uStack_1fc = local_208;
  local_1ec = local_208;
  uStack_1e4 = local_1e8;
  uStack_1e0 = local_1e8;
  uStack_1dc = local_1e8;
  local_1cc = local_1e8;
  std::allocator<float>::allocator((allocator<float> *)0x200016);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
             CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
             (value_type_conflict *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::allocator<float>::~allocator((allocator<float> *)0x20004a);
  local_330 = std::vector<float,_std::allocator<float>_>::data
                        ((vector<float,_std::allocator<float>_> *)0x200057);
  local_338._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffa58._0_8_);
  while( true ) {
    local_340 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffffa58._0_8_);
    bVar4 = __gnu_cxx::operator!=(in_stack_fffffffffffffa58._8_8_,in_stack_fffffffffffffa58._0_8_);
    if (!bVar4) break;
    pNVar6 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_338);
    local_344 = pNVar6->feat_id;
    if (local_344 < local_27c) {
      pNVar6 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_338);
      local_348 = pNVar6->feat_val;
      local_350 = Model::GetParameter_v(local_260);
      local_350 = local_350 + local_344 * local_2bc;
      local_228 = local_348 * local_268;
      local_368 = CONCAT44(local_228,local_228);
      uStack_360 = CONCAT44(local_228,local_228);
      for (local_36c = 0; fStack_224 = local_228, fStack_220 = local_228, fStack_21c = local_228,
          local_20c = local_228, local_36c < local_2b8; local_36c = local_36c + 4) {
        local_190 = local_330 + local_36c;
        uVar1 = *(undefined8 *)local_190;
        uVar2 = *(undefined8 *)(local_190 + 2);
        local_198 = local_350 + local_36c;
        local_398 = *(undefined8 *)local_198;
        uStack_390 = *(undefined8 *)(local_198 + 2);
        local_98._0_4_ = (float)local_398;
        local_98._4_4_ = (float)((ulong)local_398 >> 0x20);
        uStack_90._0_4_ = (float)uStack_390;
        uStack_90._4_4_ = (float)((ulong)uStack_390 >> 0x20);
        local_168 = CONCAT44(local_98._4_4_ * local_228,(float)local_98 * local_228);
        uStack_160 = CONCAT44(uStack_90._4_4_ * local_228,(float)uStack_90 * local_228);
        local_158._0_4_ = (float)uVar1;
        local_158._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_150._0_4_ = (float)uVar2;
        uStack_150._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_388 = CONCAT44(local_158._4_4_ + local_98._4_4_ * local_228,
                             (float)local_158 + (float)local_98 * local_228);
        uStack_380 = CONCAT44(uStack_150._4_4_ + uStack_90._4_4_ * local_228,
                              (float)uStack_150 + (float)uStack_90 * local_228);
        local_50 = local_330 + local_36c;
        *(undefined8 *)local_50 = local_388;
        *(undefined8 *)(local_50 + 2) = uStack_380;
        local_158 = uVar1;
        uStack_150 = uVar2;
        local_a8 = local_368;
        uStack_a0 = uStack_360;
        local_98 = local_398;
        uStack_90 = uStack_390;
        local_68 = local_388;
        uStack_60 = uStack_380;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_338);
  }
  local_3a0._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffffa58._0_8_);
  while( true ) {
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_fffffffffffffa58._0_8_);
    bVar4 = __gnu_cxx::operator!=(in_stack_fffffffffffffa58._8_8_,in_stack_fffffffffffffa58._0_8_);
    if (!bVar4) break;
    pNVar6 = __gnu_cxx::
             __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
             ::operator->(&local_3a0);
    uVar8 = pNVar6->feat_id;
    if (uVar8 < local_27c) {
      pNVar6 = __gnu_cxx::
               __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
               ::operator->(&local_3a0);
      fVar10 = pNVar6->feat_val;
      prVar7 = Model::GetParameter_v(local_260);
      uVar8 = uVar8 * local_2bc;
      local_248 = fVar10 * local_268;
      local_c8 = CONCAT44(local_248,local_248);
      uStack_c0 = CONCAT44(local_248,local_248);
      local_b8 = local_2d8;
      uVar1 = local_b8;
      uStack_b0 = uStack_2d0;
      uVar2 = uStack_b0;
      local_b8._0_4_ = (float)local_2d8;
      local_b8._4_4_ = (float)((ulong)local_2d8 >> 0x20);
      uStack_b0._0_4_ = (float)uStack_2d0;
      uStack_b0._4_4_ = (float)((ulong)uStack_2d0 >> 0x20);
      fVar10 = (float)local_b8 * local_248;
      fVar13 = local_b8._4_4_ * local_248;
      fVar14 = (float)uStack_b0 * local_248;
      fVar15 = uStack_b0._4_4_ * local_248;
      for (local_3dc = 0; fStack_244 = local_248, fStack_240 = local_248, fStack_23c = local_248,
          local_22c = local_248, local_b8 = uVar1, uStack_b0 = uVar2, local_3dc < local_2b8;
          local_3dc = local_3dc + 4) {
        local_1a0 = (undefined1 (*) [16])(local_330 + local_3dc);
        local_18 = *(undefined8 *)*local_1a0;
        uStack_10 = *(undefined8 *)(*local_1a0 + 8);
        local_1a8 = (undefined1 (*) [16])(prVar7 + (ulong)uVar8 + (ulong)local_3dc);
        local_f8 = *(undefined8 *)*local_1a8;
        in_stack_fffffffffffffa70 = *(vector<float,_std::allocator<float>_> **)(*local_1a8 + 8);
        local_d8._0_4_ = (float)local_2f8;
        local_d8._4_4_ = (float)((ulong)local_2f8 >> 0x20);
        uStack_d0._0_4_ = (float)uStack_2f0;
        uStack_d0._4_4_ = (float)((ulong)uStack_2f0 >> 0x20);
        local_e8._0_4_ = (float)local_f8;
        local_e8._4_4_ = (float)((ulong)local_f8 >> 0x20);
        uStack_e0._0_4_ = SUB84(in_stack_fffffffffffffa70,0);
        uStack_e0._4_4_ = (float)((ulong)in_stack_fffffffffffffa70 >> 0x20);
        local_28 = CONCAT44(local_e8._4_4_ * local_248,(float)local_e8 * local_248);
        uStack_20 = CONCAT44(uStack_e0._4_4_ * local_248,(float)uStack_e0 * local_248);
        auVar3._8_8_ = uStack_20;
        auVar3._0_8_ = local_28;
        auVar12 = vsubps_avx(*local_1a0,auVar3);
        local_558 = auVar12._0_8_;
        uStack_550 = auVar12._8_8_;
        local_128._0_4_ = auVar12._0_4_;
        local_128._4_4_ = auVar12._4_4_;
        uStack_120._0_4_ = auVar12._8_4_;
        uStack_120._4_4_ = auVar12._12_4_;
        local_128._0_4_ = fVar10 * (float)local_128;
        local_128._4_4_ = fVar13 * local_128._4_4_;
        uStack_120._0_4_ = fVar14 * (float)uStack_120;
        uStack_120._4_4_ = fVar15 * uStack_120._4_4_;
        local_188 = CONCAT44(local_128._4_4_,(float)local_128);
        uStack_180 = CONCAT44(uStack_120._4_4_,(float)uStack_120);
        local_178 = CONCAT44(local_d8._4_4_ * local_e8._4_4_,(float)local_d8 * (float)local_e8);
        uStack_170 = CONCAT44(uStack_d0._4_4_ * uStack_e0._4_4_,(float)uStack_d0 * (float)uStack_e0)
        ;
        local_128._0_4_ = (float)local_d8 * (float)local_e8 + (float)local_128;
        local_128._4_4_ = local_d8._4_4_ * local_e8._4_4_ + local_128._4_4_;
        uStack_120._0_4_ = (float)uStack_d0 * (float)uStack_e0 + (float)uStack_120;
        uStack_120._4_4_ = uStack_d0._4_4_ * uStack_e0._4_4_ + uStack_120._4_4_;
        local_148 = CONCAT44(local_128._4_4_,(float)local_128);
        uStack_140 = CONCAT44(uStack_120._4_4_,(float)uStack_120);
        local_138._0_4_ = (float)local_2e8;
        local_138._4_4_ = (float)((ulong)local_2e8 >> 0x20);
        uStack_130._0_4_ = (float)uStack_2e0;
        uStack_130._4_4_ = (float)((ulong)uStack_2e0 >> 0x20);
        local_48 = CONCAT44(local_138._4_4_ * local_128._4_4_,(float)local_138 * (float)local_128);
        uStack_40 = CONCAT44(uStack_130._4_4_ * uStack_120._4_4_,
                             (float)uStack_130 * (float)uStack_120);
        auVar12._8_8_ = uStack_40;
        auVar12._0_8_ = local_48;
        in_stack_fffffffffffffa58 = vsubps_avx(*local_1a8,auVar12);
        local_88 = in_stack_fffffffffffffa58._0_8_;
        uStack_80 = in_stack_fffffffffffffa58._8_8_;
        local_70 = prVar7 + (ulong)uVar8 + (ulong)local_3dc;
        *(undefined8 *)local_70 = local_88;
        *(undefined8 *)(local_70 + 2) = uStack_80;
        local_138 = local_2e8;
        uStack_130 = uStack_2e0;
        local_128 = local_558;
        uStack_120 = uStack_550;
        local_118 = CONCAT44(fVar13,fVar10);
        uStack_110 = CONCAT44(fVar15,fVar14);
        local_108 = local_c8;
        uStack_100 = uStack_c0;
        pvStack_f0 = in_stack_fffffffffffffa70;
        local_e8 = local_f8;
        uStack_e0 = in_stack_fffffffffffffa70;
        local_d8 = local_2f8;
        uStack_d0 = uStack_2f0;
        local_38 = local_f8;
        pvStack_30 = in_stack_fffffffffffffa70;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_3a0);
  }
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffa70);
  return;
}

Assistant:

void FMScore::calc_grad_sgd(const SparseRow* row,
                            Model& model,
                            real_t pg,
                            real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= learning_rate_ * g;
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= learning_rate_ * g;
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
  // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for(index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w+d);
      __m128 XMMg = _mm_add_ps(_mm_mul_ps(XMMlamb, XMMw),
        _mm_mul_ps(XMMpgv, _mm_sub_ps(XMMs,
        _mm_mul_ps(XMMw, XMMv))));
      XMMw = _mm_sub_ps(XMMw, _mm_mul_ps(XMMlr, XMMg));
      _mm_store_ps(w+d, XMMw);
    }
  }
}